

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

void readRestartInterval(ifstream *inFile,Header *header)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint length;
  Header *header_local;
  ifstream *inFile_local;
  
  std::operator<<((ostream *)&std::cout,"Reading Restart Interval \n");
  iVar1 = std::istream::get();
  iVar2 = std::istream::get();
  iVar3 = std::istream::get();
  iVar4 = std::istream::get();
  header->restartInterval = iVar3 * 0x100 + iVar4;
  if (iVar1 * 0x100 + iVar2 != 4) {
    std::operator<<((ostream *)&std::cout,"Error read Restart Interval \n");
    header->valid = false;
  }
  return;
}

Assistant:

void readRestartInterval(std::ifstream& inFile, Header* const header) {
	std::cout << "Reading Restart Interval \n";
	uint length = (inFile.get() << 8) + inFile.get();
	header->restartInterval = (inFile.get() << 8) + inFile.get();
	if (length - 4 != 0) {
		std::cout << "Error read Restart Interval \n";
		header->valid = false;
	}
}